

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::RadixScatterArrayVector
               (Vector *v,UnifiedVectorFormat *vdata,idx_t vcount,SelectionVector *sel,
               idx_t add_count,data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,
               idx_t prefix_len,idx_t width,idx_t offset)

{
  data_ptr_t *ppdVar1;
  size_t __n;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  Vector *v_00;
  idx_t vcount_00;
  SelectionVector *pSVar5;
  byte *pbVar6;
  idx_t i;
  idx_t iVar7;
  idx_t iVar8;
  byte *pbVar9;
  idx_t i_1;
  data_ptr_t pdVar10;
  
  v_00 = ArrayVector::GetEntry(v);
  vcount_00 = ArrayType::GetSize(&v->type);
  if (has_null) {
    __n = width - 1;
    for (iVar7 = 0; iVar7 != add_count; iVar7 = iVar7 + 1) {
      iVar8 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      ppdVar1 = key_locations + iVar7;
      pdVar10 = *ppdVar1;
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar8 + offset);
      pdVar3 = *ppdVar1;
      *ppdVar1 = pdVar3 + 1;
      if (bVar4) {
        *pdVar3 = nulls_first;
        pSVar5 = FlatVector::IncrementalSelectionVector();
        RowOperations::RadixScatter
                  (v_00,vcount_00,pSVar5,1,ppdVar1,false,true,false,prefix_len,__n,
                   (iVar8 + offset) * vcount_00);
        if (desc) {
          pbVar6 = pdVar10 + width;
          while( true ) {
            pbVar9 = pdVar10 + 1;
            *ppdVar1 = pbVar9;
            if (pbVar6 <= pbVar9) break;
            *pbVar9 = ~*pbVar9;
            pdVar10 = *ppdVar1;
          }
        }
      }
      else {
        *pdVar3 = !nulls_first;
        switchD_016d8eb1::default(*ppdVar1,0,__n);
        *ppdVar1 = *ppdVar1 + __n;
      }
    }
  }
  else {
    for (iVar7 = 0; iVar7 != add_count; iVar7 = iVar7 + 1) {
      iVar8 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      ppdVar1 = key_locations + iVar7;
      pbVar6 = *ppdVar1;
      pSVar5 = FlatVector::IncrementalSelectionVector();
      RowOperations::RadixScatter
                (v_00,vcount_00,pSVar5,1,ppdVar1,false,true,false,prefix_len,width,
                 (iVar8 + offset) * vcount_00);
      if (desc) {
        pbVar9 = pbVar6 + width;
        while (*ppdVar1 = pbVar6, pbVar6 < pbVar9) {
          *pbVar6 = ~*pbVar6;
          pbVar6 = *ppdVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void RadixScatterArrayVector(Vector &v, UnifiedVectorFormat &vdata, idx_t vcount, const SelectionVector &sel,
                             idx_t add_count, data_ptr_t *key_locations, const bool desc, const bool has_null,
                             const bool nulls_first, const idx_t prefix_len, idx_t width, const idx_t offset) {
	auto &child_vector = ArrayVector::GetEntry(v);
	auto array_size = ArrayType::GetSize(v.GetType());

	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;

				auto array_offset = source_idx * array_size;
				RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1, array_offset);

				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			auto array_offset = source_idx * array_size;
			RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
			                            key_locations + i, false, true, false, prefix_len, width, array_offset);
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}